

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimedExecution.h
# Opt level: O1

void nrg::TimedExecution::push<std::function<void()>>(Queue *queue,function<void_()> *fn)

{
  _Manager_type p_Var1;
  QueueElement elem;
  _Any_data local_60;
  _Manager_type local_50;
  _Invoker_type p_Stack_48;
  QueueElement local_40;
  
  local_40.when.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  local_60._M_unused._M_object = (void *)0x0;
  local_60._8_8_ = 0;
  local_50 = (_Manager_type)0x0;
  local_40.what._M_invoker = fn->_M_invoker;
  p_Var1 = (fn->super__Function_base)._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    local_60._M_unused._0_8_ = (undefined8)*(undefined8 *)&(fn->super__Function_base)._M_functor;
    local_60._8_8_ = *(undefined8 *)((long)&(fn->super__Function_base)._M_functor + 8);
    (fn->super__Function_base)._M_manager = (_Manager_type)0x0;
    fn->_M_invoker = (_Invoker_type)0x0;
    local_50 = p_Var1;
  }
  local_40.what.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_40.what.super__Function_base._M_functor._8_8_ = 0;
  local_40.what.super__Function_base._M_manager = (_Manager_type)0x0;
  p_Stack_48 = local_40.what._M_invoker;
  if (local_50 != (_Manager_type)0x0) {
    local_40.what.super__Function_base._M_functor._M_unused._M_object = local_60._M_unused._M_object
    ;
    local_40.what.super__Function_base._M_functor._8_8_ = local_60._8_8_;
    local_40.what.super__Function_base._M_manager = local_50;
    local_50 = (_Manager_type)0x0;
    p_Stack_48 = (_Invoker_type)0x0;
  }
  std::vector<nrg::TimedExecution::QueueElement,_std::allocator<nrg::TimedExecution::QueueElement>_>
  ::emplace_back<nrg::TimedExecution::QueueElement>(&queue->c,&local_40);
  std::
  push_heap<__gnu_cxx::__normal_iterator<nrg::TimedExecution::QueueElement*,std::vector<nrg::TimedExecution::QueueElement,std::allocator<nrg::TimedExecution::QueueElement>>>,std::greater<nrg::TimedExecution::QueueElement>>
            ((queue->c).
             super__Vector_base<nrg::TimedExecution::QueueElement,_std::allocator<nrg::TimedExecution::QueueElement>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (queue->c).
             super__Vector_base<nrg::TimedExecution::QueueElement,_std::allocator<nrg::TimedExecution::QueueElement>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  if (local_40.what.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_40.what.super__Function_base._M_manager)
              ((_Any_data *)&local_40.what,(_Any_data *)&local_40.what,__destroy_functor);
  }
  if (local_50 != (_Manager_type)0x0) {
    (*local_50)(&local_60,&local_60,__destroy_functor);
  }
  return;
}

Assistant:

static void push(Queue& queue, FN fn)
    {
        QueueElement elem = { now(), std::move(fn) };
        push(queue, std::move(elem));
    }